

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O0

apx_size_t rmf_encode_open_file_cmd(uint8_t *buf,apx_size_t buf_size,uint32_t address)

{
  uint8_t *p;
  apx_size_t required_size;
  uint32_t address_local;
  apx_size_t buf_size_local;
  uint8_t *buf_local;
  
  if ((address < 0x40000000) && (7 < buf_size)) {
    packLE(buf,10,'\x04');
    packLE(buf + 4,address,'\x04');
    buf_local._4_4_ = 8;
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

apx_size_t rmf_encode_open_file_cmd(uint8_t* buf, apx_size_t buf_size, uint32_t address)
{
   apx_size_t const required_size = RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE;
   if ((address > RMF_HIGH_ADDR_MAX) || (required_size > buf_size))
   {
      return 0;
   }
   uint8_t* p = buf;
   packLE(p, RMF_CMD_OPEN_FILE_MSG, (uint8_t)UINT32_SIZE); p += UINT32_SIZE;
   packLE(p, address, (uint8_t)UINT32_SIZE); p += UINT32_SIZE;
   return required_size;
}